

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_currency.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::CombinedCurrencyMatcher::matchCurrency
          (CombinedCurrencyMatcher *this,StringSegment *segment,ParsedNumber *result,
          UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  char *locale;
  UnicodeString *other;
  bool bVar4;
  bool bVar5;
  bool local_10d;
  int32_t overlap;
  UnicodeString *name;
  int local_a8;
  int32_t i;
  int32_t longestFullMatch;
  int32_t partialMatchLen;
  undefined1 local_90 [8];
  ParsePosition ppos;
  UnicodeString segmentString;
  int local_38;
  int32_t overlap2;
  int32_t overlap1;
  bool maybeMore;
  UErrorCode *status_local;
  ParsedNumber *result_local;
  StringSegment *segment_local;
  CombinedCurrencyMatcher *this_local;
  
  UVar1 = UnicodeString::isEmpty(&this->fCurrency1);
  if (UVar1 == '\0') {
    local_38 = StringSegment::getCaseSensitivePrefixLength(segment,&this->fCurrency1);
  }
  else {
    local_38 = -1;
  }
  iVar2 = StringSegment::length(segment);
  iVar3 = UnicodeString::length(&this->fCurrency1);
  if (local_38 == iVar3) {
    utils::copyCurrencyCode(result->currencyCode,this->fCurrencyCode);
    StringSegment::adjustOffset(segment,local_38);
    ParsedNumber::setCharsConsumed(result,segment);
    this_local._7_1_ = local_38 == iVar2;
  }
  else {
    UVar1 = UnicodeString::isEmpty(&this->fCurrency2);
    if (UVar1 == '\0') {
      segmentString.fUnion._52_4_ = StringSegment::getCommonPrefixLength(segment,&this->fCurrency2);
    }
    else {
      segmentString.fUnion._52_4_ = 0xffffffff;
    }
    bVar4 = true;
    if (local_38 != iVar2) {
      iVar2 = StringSegment::length(segment);
      bVar4 = segmentString.fUnion._52_4_ == iVar2;
    }
    iVar2 = UnicodeString::length(&this->fCurrency2);
    if (segmentString.fUnion._52_4_ == iVar2) {
      utils::copyCurrencyCode(result->currencyCode,this->fCurrencyCode);
      StringSegment::adjustOffset(segment,segmentString.fUnion._52_4_);
      ParsedNumber::setCharsConsumed(result,segment);
      this_local._7_1_ = bVar4;
    }
    else {
      if ((this->fUseFullCurrencyData & 1U) == 0) {
        local_a8 = 0;
        this_local._7_1_ = bVar4;
        for (name._4_4_ = 0; name._4_4_ < 6; name._4_4_ = name._4_4_ + 1) {
          other = (UnicodeString *)(&this->field_0x98 + (long)name._4_4_ * 0x40);
          iVar2 = StringSegment::getCommonPrefixLength(segment,other);
          iVar3 = UnicodeString::length(other);
          if ((iVar2 == iVar3) && (iVar3 = UnicodeString::length(other), local_a8 < iVar3)) {
            local_a8 = UnicodeString::length(other);
          }
          local_10d = (bool)this_local._7_1_ != false || 0 < iVar2;
          this_local._7_1_ = local_10d;
        }
        bVar5 = (bool)this_local._7_1_;
        if (0 < local_a8) {
          utils::copyCurrencyCode(result->currencyCode,this->fCurrencyCode);
          StringSegment::adjustOffset(segment,local_a8);
          ParsedNumber::setCharsConsumed(result,segment);
          goto LAB_00313c53;
        }
      }
      else {
        StringSegment::toTempUnicodeString((UnicodeString *)&ppos.index,segment);
        ParsePosition::ParsePosition((ParsePosition *)local_90,0);
        longestFullMatch = 0;
        locale = CharString::data(&this->fLocaleName);
        uprv_parseCurrency_63
                  (locale,(UnicodeString *)&ppos.index,(ParsePosition *)local_90,'\0',
                   &longestFullMatch,result->currencyCode,status);
        iVar2 = longestFullMatch;
        bVar5 = true;
        if (bVar4 == false) {
          iVar3 = StringSegment::length(segment);
          bVar5 = iVar2 == iVar3;
        }
        UVar1 = ::U_SUCCESS(*status);
        if ((UVar1 == '\0') ||
           (iVar2 = ParsePosition::getIndex((ParsePosition *)local_90), iVar2 == 0)) {
          bVar4 = false;
        }
        else {
          iVar2 = ParsePosition::getIndex((ParsePosition *)local_90);
          StringSegment::adjustOffset(segment,iVar2);
          ParsedNumber::setCharsConsumed(result,segment);
          bVar4 = true;
          this_local._7_1_ = bVar5;
        }
        ParsePosition::~ParsePosition((ParsePosition *)local_90);
        UnicodeString::~UnicodeString((UnicodeString *)&ppos.index);
        if (bVar4) goto LAB_00313c53;
      }
      this_local._7_1_ = bVar5;
    }
  }
LAB_00313c53:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CombinedCurrencyMatcher::matchCurrency(StringSegment& segment, ParsedNumber& result,
                                            UErrorCode& status) const {
    bool maybeMore = false;

    int32_t overlap1;
    if (!fCurrency1.isEmpty()) {
        overlap1 = segment.getCaseSensitivePrefixLength(fCurrency1);
    } else {
        overlap1 = -1;
    }
    maybeMore = maybeMore || overlap1 == segment.length();
    if (overlap1 == fCurrency1.length()) {
        utils::copyCurrencyCode(result.currencyCode, fCurrencyCode);
        segment.adjustOffset(overlap1);
        result.setCharsConsumed(segment);
        return maybeMore;
    }

    int32_t overlap2;
    if (!fCurrency2.isEmpty()) {
        // ISO codes should be accepted case-insensitive.
        // https://unicode-org.atlassian.net/browse/ICU-13696
        overlap2 = segment.getCommonPrefixLength(fCurrency2);
    } else {
        overlap2 = -1;
    }
    maybeMore = maybeMore || overlap2 == segment.length();
    if (overlap2 == fCurrency2.length()) {
        utils::copyCurrencyCode(result.currencyCode, fCurrencyCode);
        segment.adjustOffset(overlap2);
        result.setCharsConsumed(segment);
        return maybeMore;
    }

    if (fUseFullCurrencyData) {
        // Use the full currency data.
        // NOTE: This call site should be improved with #13584.
        const UnicodeString segmentString = segment.toTempUnicodeString();

        // Try to parse the currency
        ParsePosition ppos(0);
        int32_t partialMatchLen = 0;
        uprv_parseCurrency(
                fLocaleName.data(),
                segmentString,
                ppos,
                UCURR_SYMBOL_NAME, // checks for both UCURR_SYMBOL_NAME and UCURR_LONG_NAME
                &partialMatchLen,
                result.currencyCode,
                status);
        maybeMore = maybeMore || partialMatchLen == segment.length();

        if (U_SUCCESS(status) && ppos.getIndex() != 0) {
            // Complete match.
            // NOTE: The currency code should already be saved in the ParsedNumber.
            segment.adjustOffset(ppos.getIndex());
            result.setCharsConsumed(segment);
            return maybeMore;
        }

    } else {
        // Use the locale long names.
        int32_t longestFullMatch = 0;
        for (int32_t i=0; i<StandardPlural::COUNT; i++) {
            const UnicodeString& name = fLocalLongNames[i];
            int32_t overlap = segment.getCommonPrefixLength(name);
            if (overlap == name.length() && name.length() > longestFullMatch) {
                longestFullMatch = name.length();
            }
            maybeMore = maybeMore || overlap > 0;
        }
        if (longestFullMatch > 0) {
            utils::copyCurrencyCode(result.currencyCode, fCurrencyCode);
            segment.adjustOffset(longestFullMatch);
            result.setCharsConsumed(segment);
            return maybeMore;
        }
    }

    // No match found.
    return maybeMore;
}